

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::generateFragShaderOutputDecl
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *outLocationMap,string *outputPrefix)

{
  pointer key;
  pointer pSVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  mapped_type_conflict *pmVar5;
  ostream *poVar6;
  ostream *poVar7;
  InternalError *this;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  int local_158;
  undefined4 local_154;
  int local_150;
  int local_14c;
  ostream *local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_140;
  string *local_138;
  ShaderSpec *local_130;
  VarType uintType_1;
  string outVarName;
  VariableDeclaration decl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  VarType uintType;
  string local_50;
  
  local_154 = (undefined4)CONCAT71(in_register_00000011,useIntOutputs);
  iVar2 = 0;
  local_148 = src;
  local_140 = outLocationMap;
  local_138 = outputPrefix;
  local_130 = shaderSpec;
  do {
    pSVar1 = (local_130->outputs).
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_130->outputs).
                     super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= iVar2) {
      return;
    }
    key = pSVar1 + iVar2;
    local_150 = iVar2;
    pmVar5 = de::
             lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                       (local_140,&key->name);
    iVar4 = *pmVar5;
    std::operator+(&outVarName,local_138,&key->name);
    local_14c = iVar4;
    glu::Layout::Layout((Layout *)&uintType,iVar4,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&decl,&pSVar1[iVar2].varType,&outVarName,STORAGE_OUT,INTERPOLATION_LAST,
               (Layout *)&uintType,0);
    poVar6 = local_148;
    if (pSVar1[iVar2].varType.m_type != TYPE_BASIC) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,(char *)0x0,"output.varType.isBasicType()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                 ,0x135);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    DVar3 = (key->varType).m_data.basic.type;
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uintType;
    if (((char)local_154 == '\0') || (3 < DVar3 - TYPE_FLOAT)) {
      if (DVar3 - TYPE_BOOL < 4) {
        iVar2 = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < iVar2) {
          DVar3 = glu::getDataTypeIntVec(iVar2);
        }
        glu::VarType::VarType(&uintType,DVar3,PRECISION_HIGHP);
        glu::VarType::operator=(&decl.varType,&uintType);
        poVar6 = glu::operator<<(poVar6,&decl);
        std::operator<<(poVar6,";\n");
        goto LAB_01507c72;
      }
      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
        iVar2 = glu::getDataTypeMatrixNumRows(DVar3);
        iVar4 = glu::getDataTypeMatrixNumColumns((key->varType).m_data.basic.type);
        DVar3 = glu::getDataTypeUintVec(iVar2);
        glu::VarType::VarType(&uintType_1,DVar3,PRECISION_HIGHP);
        glu::VarType::operator=(&decl.varType,&uintType_1);
        for (local_158 = 0; local_158 < iVar4; local_158 = local_158 + 1) {
          std::operator+(&local_90,&outVarName,"_");
          de::toString<int>(&local_50,&local_158);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &uintType,&local_90,&local_50);
          std::__cxx11::string::operator=((string *)&decl.name,(string *)&uintType);
          std::__cxx11::string::~string((string *)&uintType);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
          decl.layout.location = local_158 + local_14c;
          poVar7 = glu::operator<<(poVar6,&decl);
          std::operator<<(poVar7,";\n");
        }
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uintType_1;
        goto LAB_01507c72;
      }
      poVar6 = glu::operator<<(local_148,&decl);
      std::operator<<(poVar6,";\n");
    }
    else {
      iVar2 = glu::getDataTypeScalarSize(DVar3);
      DVar3 = TYPE_UINT;
      if (1 < iVar2) {
        DVar3 = glu::getDataTypeUintVec(iVar2);
      }
      glu::VarType::VarType(&uintType,DVar3,PRECISION_HIGHP);
      glu::VarType::operator=(&decl.varType,&uintType);
      poVar6 = glu::operator<<(poVar6,&decl);
      std::operator<<(poVar6,";\n");
LAB_01507c72:
      glu::VarType::~VarType((VarType *)pbVar8);
    }
    glu::VariableDeclaration::~VariableDeclaration(&decl);
    std::__cxx11::string::~string((string *)&outVarName);
    iVar2 = local_150 + 1;
  } while( true );
}

Assistant:

static void generateFragShaderOutputDecl (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	for (int outNdx = 0; outNdx < (int)shaderSpec.outputs.size(); ++outNdx)
	{
		const Symbol&				output		= shaderSpec.outputs[outNdx];
		const int					location	= de::lookup(outLocationMap, output.name);
		const std::string			outVarName	= outputPrefix + output.name;
		glu::VariableDeclaration	decl		(output.varType, outVarName, glu::STORAGE_OUT, glu::INTERPOLATION_LAST, glu::Layout(location));

		TCU_CHECK_INTERNAL(output.varType.isBasicType());

		if (useIntOutputs && glu::isDataTypeFloatOrVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	intBasicType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType	intType			(intBasicType, glu::PRECISION_HIGHP);

			decl.varType = intType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeMatrix(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeMatrixNumRows(output.varType.getBasicType());
			const int			numVecs			= glu::getDataTypeMatrixNumColumns(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= glu::getDataTypeUintVec(vecSize);
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
			{
				decl.name				= outVarName + "_" + de::toString(vecNdx);
				decl.layout.location	= location + vecNdx;
				src << decl << ";\n";
			}
		}
		else
			src << decl << ";\n";
	}
}